

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint8_t *start)

{
  byte *in_RSI;
  ValueLength l;
  uint8_t *in_stack_00000020;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_stack_00000028;
  ulong local_8;
  
  local_8 = (ulong)"\x01\x01"[*in_RSI];
  if (local_8 == 0) {
    local_8 = byteSizeDynamic(in_stack_00000028,in_stack_00000020);
  }
  return local_8;
}

Assistant:

ValueLength byteSize(uint8_t const* start) const {
    // check if the type has a fixed length first
    ValueLength l =
        static_cast<ValueLength>(SliceStaticData::FixedTypeLengths[*start]);
    if (l != 0) {
      // return fixed length
      return l;
    }
    return byteSizeDynamic(start);
  }